

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

reference<mpt::layout::graph::transform3> * __thiscall
mpt::reference<mpt::layout::graph::transform3>::operator=
          (reference<mpt::layout::graph::transform3> *this,
          reference<mpt::layout::graph::transform3> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  uintptr_t uVar2;
  transform3 *ptVar3;
  transform3 *ptVar4;
  
  ptVar4 = ref->_ref;
  ptVar3 = this->_ref;
  if (ptVar4 != ptVar3) {
    if (ptVar4 == (transform3 *)0x0) {
      ptVar4 = (transform3 *)0x0;
    }
    else {
      iVar1 = refcount::raise(&(ptVar4->super_type)._ref,(int)ref);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        ptVar4 = (transform3 *)0x0;
      }
      ptVar3 = this->_ref;
    }
    if (ptVar3 != (transform3 *)0x0) {
      uVar2 = refcount::lower(&(ptVar3->super_type)._ref);
      if (uVar2 == 0) {
        (*(ptVar3->super_type).super_transform._vptr_transform[5])(ptVar3);
      }
    }
    this->_ref = ptVar4;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}